

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall
Corrade::Utility::String::replaceAll
          (String *__return_storage_ptr__,String *this,StringView string,StringView search,
          StringView replace)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  _func_void_char_ptr_unsigned_long *deleter;
  String *pSVar3;
  char *end;
  ostream *poVar4;
  char *pcVar5;
  type values;
  type values_00;
  type values_01;
  StringView substring;
  BasicStringView<const_char> BVar6;
  Array<char,_void_(*)(char_*,_unsigned_long)> output;
  BasicStringView<const_char> local_c0;
  undefined1 local_b0 [40];
  Array<char,_void_(*)(char_*,_unsigned_long)> local_88;
  String *local_70;
  char *local_68;
  Array<char,_void_(*)(char_*,_unsigned_long)> *local_60;
  char *local_58;
  Array<char,_void_(*)(char_*,_unsigned_long)> *local_50;
  char *local_48;
  Array<char,_void_(*)(char_*,_unsigned_long)> *local_40;
  char *local_38;
  
  pcVar5 = (char *)string._sizePlusFlags;
  local_c0._sizePlusFlags = (size_t)string._data;
  local_c0._data = (char *)this;
  local_70 = __return_storage_ptr__;
  local_68 = pcVar5;
  if (((undefined1  [16])search & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0) {
    poVar4 = Error::defaultOutput();
    Error::Error((Error *)local_b0,poVar4,(Flags)0x0);
    Debug::operator<<((Debug *)local_b0,
                      "Utility::String::replaceAll(): empty search string would cause an infinite loop"
                     );
  }
  else {
    local_88._data = (char *)0x0;
    local_88._size = 0;
    local_88._deleter = (_func_void_char_ptr_unsigned_long *)0x0;
    while( true ) {
      substring._sizePlusFlags = (size_t)search._data;
      substring._data = local_68;
      BVar6 = Containers::BasicStringView<const_char>::find(&local_c0,substring);
      end = BVar6._data;
      if ((end == (char *)0x0) ||
         (((undefined1  [16])BVar6 & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0)
         ) break;
      local_b0._0_16_ =
           (undefined1  [16])
           Containers::BasicStringView<const_char>::prefix<const_char_*,_0>(&local_c0,end);
      Containers::ArrayView<char_const>::
      ArrayView<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::ArrayView<char_const>>
                ((ArrayView<char_const> *)&local_50,(BasicStringView<const_char> *)local_b0);
      values._size = (size_t)pcVar5;
      values._data = local_48;
      Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
                ((Containers *)&local_88,local_50,values);
      Containers::ArrayView<char_const>::
      ArrayView<Corrade::Containers::BasicStringView<char_const>const&,Corrade::Containers::ArrayView<char_const>>
                ((ArrayView<char_const> *)&local_60,&replace);
      values_00._size = (size_t)pcVar5;
      values_00._data = local_58;
      Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
                ((Containers *)&local_88,local_60,values_00);
      local_c0 = Containers::BasicStringView<const_char>::slice
                           (&local_c0,end + (BVar6._sizePlusFlags & 0x3fffffffffffffff),
                            local_c0._data + (local_c0._sizePlusFlags & 0x3fffffffffffffff));
    }
    Containers::ArrayView<char_const>::
    ArrayView<Corrade::Containers::BasicStringView<char_const>&,Corrade::Containers::ArrayView<char_const>>
              ((ArrayView<char_const> *)&local_40,&local_c0);
    values_01._size = (size_t)pcVar5;
    values_01._data = local_38;
    Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
              ((Containers *)&local_88,local_40,values_01);
    auVar1[0xf] = 0;
    auVar1._0_15_ = local_b0._1_15_;
    local_b0._0_16_ = auVar1 << 8;
    Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
              (&local_88,local_b0);
    pSVar3 = local_70;
    deleter = local_88._deleter;
    sVar2 = local_88._size;
    pcVar5 = local_88._data;
    if (local_88._deleter != (_func_void_char_ptr_unsigned_long *)0x0) {
      local_88._data = (char *)0x0;
      local_88._size = 0;
      local_88._deleter = (_func_void_char_ptr_unsigned_long *)0x0;
      Containers::String::String(local_70,pcVar5,sVar2 - 1,(_func_void_char_ptr_size_t *)deleter);
      Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::~Array(&local_88);
      return pSVar3;
    }
    poVar4 = Error::defaultOutput();
    Error::Error((Error *)local_b0,poVar4,(Flags)0x0);
    Debug::operator<<((Debug *)local_b0,
                      "Assertion deleter failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/String.cpp:1110"
                     );
  }
  Error::~Error((Error *)local_b0);
  abort();
}

Assistant:

Containers::String replaceAll(Containers::StringView string, const Containers::StringView search, const Containers::StringView replace) {
    CORRADE_ASSERT(!search.isEmpty(),
        "Utility::String::replaceAll(): empty search string would cause an infinite loop", {});
    Containers::Array<char> output;
    while(const Containers::StringView found = string.find(search)) {
        arrayAppend(output, string.prefix(found.begin()));
        arrayAppend(output, replace);
        string = string.slice(found.end(), string.end());
    }
    arrayAppend(output, string);
    arrayAppend(output, '\0');
    const std::size_t size = output.size();
    /* This assumes that the growable array uses std::malloc() (which has to be
       std::free()'d later) in order to be able to std::realloc(). The deleter
       doesn't use the size argument so it should be fine to transfer it over
       to a String with the size excluding the null terminator. */
    void(*const deleter)(char*, std::size_t) = output.deleter();
    CORRADE_INTERNAL_ASSERT(deleter);
    return Containers::String{output.release(), size - 1, deleter};
}